

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

void __thiscall
dg::dda::MemorySSATransformation::fillDefinitionsFromCall
          (MemorySSATransformation *this,Definitions *D,RWNodeCall *C)

{
  pointer pRVar1;
  RWSubgraph *s;
  _Hash_node_base _Var2;
  RWNode *pRVar3;
  int iVar4;
  pointer pRVar5;
  SubgraphInfo *si;
  _Rb_tree_node_base *p_Var6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  __node_base *p_Var7;
  const_iterator __begin6;
  DefSite local_48;
  
  if (D->_processed == false) {
    pRVar1 = (C->callees).
             super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pRVar5 = (C->callees).
                  super__Vector_base<dg::dda::RWCalledValue,_std::allocator<dg::dda::RWCalledValue>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar1; pRVar5 = pRVar5 + 1)
    {
      s = pRVar5->subgraph;
      if (s == (RWSubgraph *)0x0) {
        pRVar3 = pRVar5->calledValue;
        iVar4 = (*pRVar3->_vptr_RWNode[2])(pRVar3);
        for (p_Var6 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var,iVar4) + 0x18);
            p_Var6 != (_Rb_tree_node_base *)(CONCAT44(extraout_var,iVar4) + 8);
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          fillDefinitionsFromCall(this,D,C,(DefSite *)(p_Var6 + 1));
        }
        iVar4 = (*pRVar3->_vptr_RWNode[2])(pRVar3);
        for (p_Var6 = *(_Rb_tree_node_base **)(CONCAT44(extraout_var_00,iVar4) + 0x48);
            p_Var6 != (_Rb_tree_node_base *)(CONCAT44(extraout_var_00,iVar4) + 0x38);
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
          fillDefinitionsFromCall(this,D,C,(DefSite *)(p_Var6 + 1));
        }
      }
      else {
        si = getSubgraphInfo(this,s);
        computeModRef(this,s,si);
        p_Var7 = &(si->modref).maydef._definitions._M_h._M_before_begin;
        while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
          p_Var6 = (_Rb_tree_node_base *)p_Var7[5]._M_nxt;
          if ((_Hash_node_base *)UNKNOWN_MEMORY == p_Var7[1]._M_nxt) {
            for (; p_Var6 != (_Rb_tree_node_base *)(p_Var7 + 3);
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
              std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
              insert<std::_Rb_tree_const_iterator<dg::dda::RWNode*>,void>
                        ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)
                         &D->unknownWrites,
                         (const_iterator)
                         (D->unknownWrites).
                         super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,p_Var6[2]._M_parent,
                         (_Rb_tree_const_iterator<dg::dda::RWNode_*>)&p_Var6[1]._M_right);
            }
          }
          else {
            for (; p_Var6 != (_Rb_tree_node_base *)(p_Var7 + 3);
                p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
              _Var2._M_nxt = p_Var7[1]._M_nxt;
              local_48.len = ADT::DiscreteInterval<dg::Offset>::length
                                       ((DiscreteInterval<dg::Offset> *)(p_Var6 + 1));
              local_48.offset.offset = *(type *)(p_Var6 + 1);
              local_48.target = (RWNode *)_Var2._M_nxt;
              fillDefinitionsFromCall(this,D,C,&local_48);
            }
          }
        }
      }
    }
    D->_processed = true;
  }
  return;
}

Assistant:

void MemorySSATransformation::fillDefinitionsFromCall(Definitions &D,
                                                      RWNodeCall *C) {
    if (D.isProcessed()) {
        return;
    }

    DBG_SECTION_BEGIN(dda, "Finding all definitions for a call " << C);

    for (auto &callee : C->getCallees()) {
        auto *subg = callee.getSubgraph();
        if (!subg) {
            auto *called = callee.getCalledValue();
            for (const auto &ds : called->getDefines()) {
                fillDefinitionsFromCall(D, C, ds);
            }
            for (const auto &ds : called->getOverwrites()) {
                fillDefinitionsFromCall(D, C, ds);
            }
        } else {
            auto &si = getSubgraphInfo(subg);
            computeModRef(subg, si);
            assert(si.modref.isInitialized());

            for (const auto &it : si.modref.maydef) {
                if (it.first->isUnknown()) {
                    for (const auto &it2 : it.second) {
                        D.unknownWrites.insert(D.unknownWrites.end(),
                                               it2.second.begin(),
                                               it2.second.end());
                    }
                    continue;
                }
                for (const auto &it2 : it.second) {
                    fillDefinitionsFromCall(
                            D, C,
                            {it.first, it2.first.start, it2.first.length()});
                }
            }
        }
    }

    DBG_SECTION_BEGIN(dda, "Finding all definitions for a call "
                                   << C << " finished");
    D.setProcessed();
}